

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O3

uint64_t __thiscall helix::order_book::ask_price(order_book *this,size_t level)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  
  p_Var1 = (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    lVar2 = level + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        return (uint64_t)p_Var1[1]._M_parent;
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  return (uint64_t)(_Base_ptr)0xffffffffffffffff;
}

Assistant:

uint64_t order_book::ask_price(size_t level) const
{
    auto it = _asks.begin();
    while (it != _asks.end() && level--) {
        it++;
    }
    if (it != _asks.end()) {
        auto&& level = it->second;
        return level.price;
    }
    return std::numeric_limits<uint64_t>::max();
}